

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

void recff_ffi_xof(jit_State *J,RecordFFData *rd)

{
  undefined2 uVar1;
  CTypeID id_00;
  TRef TVar2;
  CType *pCVar3;
  jit_State *in_RSI;
  long in_RDI;
  CType *ct;
  CTypeID id;
  cTValue *in_stack_00000058;
  TRef in_stack_00000064;
  jit_State *in_stack_00000068;
  TraceError in_stack_ffffffffffffffbc;
  jit_State *in_stack_ffffffffffffffc0;
  long lVar4;
  undefined6 in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  IRType t;
  undefined4 in_stack_ffffffffffffffd8;
  
  t = (IRType)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  id_00 = argv2ctype(in_stack_00000068,in_stack_00000064,in_stack_00000058);
  if (*(int *)&(in_RSI->cur).ir == 0xc0) {
    pCVar3 = lj_ctype_rawref((CTState *)(ulong)*(uint *)(in_RDI + -0xb4),id_00);
    if ((pCVar3->info & 0xd0100000) == 0x10100000) {
      lj_trace_err(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    }
  }
  else if (*(int *)&(in_RSI->cur).ir == 0xc2) {
    if ((*(uint *)(*(long *)(in_RDI + 0x88) + 4) & 0x1f000000) != 0x4000000) {
      lj_trace_err(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    }
    uVar1 = (undefined2)*(undefined4 *)(*(long *)(in_RDI + 0x88) + 4);
    lVar4 = in_RDI;
    TVar2 = lj_ir_kgc(in_RSI,(GCobj *)CONCAT44(id_00,in_stack_ffffffffffffffd8),t);
    *(undefined2 *)(lVar4 + 0xa4) = 0x884;
    *(undefined2 *)(lVar4 + 0xa0) = uVar1;
    *(short *)(lVar4 + 0xa2) = (short)TVar2;
    lj_opt_fold((jit_State *)CONCAT26(uVar1,in_stack_ffffffffffffffc8));
    (in_RSI->cur).nins = 3;
    (in_RSI->cur).gclist = 0;
  }
  *(undefined4 *)(in_RDI + 0x164) = 5;
  *(undefined4 *)(*(long *)(in_RDI + 0x88) + 8) = 0x7fff;
  *(undefined4 *)(*(long *)(in_RDI + 0x88) + 4) = 0x7fff;
  **(undefined4 **)(in_RDI + 0x88) = 0x7fff;
  return;
}

Assistant:

void LJ_FASTCALL recff_ffi_xof(jit_State *J, RecordFFData *rd)
{
  CTypeID id = argv2ctype(J, J->base[0], &rd->argv[0]);
  if (rd->data == FF_ffi_sizeof) {
    CType *ct = lj_ctype_rawref(ctype_ctsG(J2G(J)), id);
    if (ctype_isvltype(ct->info))
      lj_trace_err(J, LJ_TRERR_BADTYPE);
  } else if (rd->data == FF_ffi_offsetof) {  /* Specialize to the field name. */
    if (!tref_isstr(J->base[1]))
      lj_trace_err(J, LJ_TRERR_BADTYPE);
    emitir(IRTG(IR_EQ, IRT_STR), J->base[1], lj_ir_kstr(J, strV(&rd->argv[1])));
    rd->nres = 3;  /* Just in case. */
  }
  J->postproc = LJ_POST_FIXCONST;
  J->base[0] = J->base[1] = J->base[2] = TREF_NIL;
}